

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.c
# Opt level: O0

int fits_get_url(fitsfile *fptr,char *realURL,char *startURL,char *realAccess,char *startAccess,
                int *iostate,int *status)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  char *in_RCX;
  char *in_RDX;
  char *in_RSI;
  char *in_R8;
  int *in_R9;
  int *in_stack_00000008;
  char *tmpPtr;
  char tmpStr4 [1025];
  char tmpStr3 [1025];
  char tmpStr2 [1025];
  char tmpStr1 [1025];
  char outfile [1025];
  char infile [1025];
  int tmpIOstate;
  int i;
  char *in_stack_ffffffffffffe748;
  fitsfile *in_stack_ffffffffffffe750;
  fitsfile *fptr_00;
  int *s1;
  char local_1898 [8];
  FITSfile *in_stack_ffffffffffffe770;
  char *in_stack_ffffffffffffe778;
  char *in_stack_ffffffffffffe780;
  char *in_stack_ffffffffffffe788;
  char *in_stack_ffffffffffffe790;
  char *in_stack_ffffffffffffe798;
  char *in_stack_ffffffffffffe7b0;
  char *in_stack_ffffffffffffe7b8;
  int *in_stack_ffffffffffffe7c0;
  int *in_stack_ffffffffffffeb60;
  char *in_stack_ffffffffffffeb68;
  int in_stack_ffffffffffffeb74;
  char cVar4;
  undefined7 in_stack_ffffffffffffeb79;
  int *in_stack_ffffffffffffeba8;
  char *in_stack_ffffffffffffebb0;
  char *in_stack_ffffffffffffebb8;
  char local_1078 [1040];
  char local_c68 [1040];
  char local_858 [1040];
  char local_448 [1032];
  int local_40;
  int local_3c;
  int *local_38;
  char *local_30;
  char *local_28;
  char *local_20;
  char *local_18;
  int local_4;
  
  local_40 = 0;
  if (*in_stack_00000008 == 0) {
    local_1898[0] = '\0';
    cVar4 = '\0';
    local_1078[0] = '\0';
    local_c68[0] = '\0';
    local_38 = in_R9;
    local_30 = in_R8;
    local_28 = in_RCX;
    local_20 = in_RDX;
    local_18 = in_RSI;
    iVar1 = ffflnm(in_stack_ffffffffffffe750,in_stack_ffffffffffffe748,(int *)0x1cc9d9);
    *in_stack_00000008 = iVar1;
    pcVar3 = &stack0xffffffffffffeb78;
    fptr_00 = (fitsfile *)local_1898;
    s1 = in_stack_00000008;
    iVar1 = ffiurl(in_stack_ffffffffffffe798,in_stack_ffffffffffffe790,in_stack_ffffffffffffe788,
                   in_stack_ffffffffffffe780,in_stack_ffffffffffffe778,
                   (char *)in_stack_ffffffffffffe770,in_stack_ffffffffffffe7b0,
                   in_stack_ffffffffffffe7b8,in_stack_ffffffffffffe7c0);
    *in_stack_00000008 = iVar1;
    if (((local_1078[0] != '\0') || (cVar4 != '\0')) || (local_1898[0] != '\0')) {
      local_40 = -1;
    }
    iVar1 = ffurlt(fptr_00,pcVar3,(int *)0x1cca8d);
    *in_stack_00000008 = iVar1;
    strcpy(local_1898,&stack0xffffffffffffeb78);
    iVar1 = ffrtnm(in_stack_ffffffffffffebb8,in_stack_ffffffffffffebb0,in_stack_ffffffffffffeba8);
    *in_stack_00000008 = iVar1;
    strcpy(local_c68,local_1078);
    iVar1 = fits_strcasecmp((char *)s1,(char *)fptr_00);
    if (iVar1 == 0) {
      local_40 = 1;
      sVar2 = strlen(local_858);
      if (sVar2 == 0) {
        local_1078[0] = '\0';
      }
      else {
        strcpy(local_c68,local_858);
      }
      pcVar3 = strstr(local_c68,"://");
      if (pcVar3 != (char *)0x0) {
        strcpy(local_448,pcVar3 + 3);
        strcpy(local_c68,local_448);
      }
      pcVar3 = strstr(local_1078,"://");
      if (pcVar3 != (char *)0x0) {
        strcpy(local_448,pcVar3 + 3);
        strcpy(local_1078,local_448);
      }
    }
    else {
      iVar1 = fits_strcasecmp((char *)s1,(char *)fptr_00);
      if (iVar1 == 0) {
        if (local_40 < 0) {
          ffpmsg((char *)0x1ccc0b);
          *in_stack_00000008 = 0x7d;
        }
        else {
          local_40 = 1;
          local_1078[0] = '\0';
        }
      }
      else {
        iVar1 = fits_strcasecmp((char *)s1,(char *)fptr_00);
        if (iVar1 == 0) {
          strcpy(&stack0xffffffffffffeb78,"mem://");
          local_1898[0] = '\0';
          local_1078[0] = '\0';
          local_40 = 1;
        }
        else {
          iVar1 = fits_strcasecmp((char *)s1,(char *)fptr_00);
          if (iVar1 == 0) {
            local_1898[0] = '\0';
            local_1078[0] = '\0';
            local_40 = 1;
          }
          else {
            iVar1 = fits_strcasecmp((char *)s1,(char *)fptr_00);
            if (iVar1 == 0) {
              local_1898[0] = '\0';
              local_1078[0] = '\0';
              local_40 = 1;
            }
            else {
              iVar1 = fits_strcasecmp((char *)s1,(char *)fptr_00);
              if (iVar1 == 0) {
                strcpy(local_c68,local_858);
                strcpy(local_1078,local_448);
                strcpy(&stack0xffffffffffffeb78,"file://");
                strcpy(local_1898,"file://");
                local_40 = 1;
              }
              else {
                iVar1 = fits_strcasecmp((char *)s1,(char *)fptr_00);
                if (iVar1 == 0) {
                  strcpy(local_c68,local_858);
                  strcpy(&stack0xffffffffffffeb78,"file://");
                  strcpy(local_1898,"http://");
                  local_40 = 1;
                }
                else {
                  iVar1 = fits_strcasecmp((char *)s1,(char *)fptr_00);
                  if (iVar1 == 0) {
                    strcpy(local_c68,local_858);
                    strcpy(&stack0xffffffffffffeb78,"file://");
                    strcpy(local_1898,"ftp://");
                    local_40 = 1;
                  }
                  else {
                    iVar1 = fits_strcasecmp((char *)s1,(char *)fptr_00);
                    if (iVar1 == 0) {
                      strcpy(local_c68,local_858);
                      strcpy(&stack0xffffffffffffeb78,"file://");
                      strcpy(local_1898,"stdin://");
                      local_40 = 1;
                    }
                    else {
                      iVar1 = fits_strcasecmp((char *)s1,(char *)fptr_00);
                      if (iVar1 == 0) {
                        local_c68[0] = '\0';
                        strcpy(local_1078,local_448);
                        strcpy(&stack0xffffffffffffeb78,"mem://");
                        strcpy(local_1898,"file://");
                        local_40 = 0;
                      }
                      else {
                        iVar1 = fits_strcasecmp((char *)s1,(char *)fptr_00);
                        if (iVar1 == 0) {
                          local_c68[0] = '\0';
                          strcpy(&stack0xffffffffffffeb78,"mem://");
                          strcpy(local_1898,"http://");
                          local_40 = 0;
                        }
                        else {
                          iVar1 = fits_strcasecmp((char *)s1,(char *)fptr_00);
                          if (iVar1 == 0) {
                            local_c68[0] = '\0';
                            strcpy(&stack0xffffffffffffeb78,"mem://");
                            strcpy(local_1898,"http://");
                            local_40 = 0;
                          }
                          else {
                            iVar1 = fits_strcasecmp((char *)s1,(char *)fptr_00);
                            if (iVar1 == 0) {
                              local_c68[0] = '\0';
                              strcpy(&stack0xffffffffffffeb78,"mem://");
                              strcpy(local_1898,"ftp://");
                              local_40 = 0;
                            }
                            else {
                              iVar1 = fits_strcasecmp((char *)s1,(char *)fptr_00);
                              if (iVar1 == 0) {
                                local_c68[0] = '\0';
                                strcpy(&stack0xffffffffffffeb78,"mem://");
                                strcpy(local_1898,"ftp://");
                                local_40 = 0;
                              }
                              else {
                                iVar1 = fits_strcasecmp((char *)s1,(char *)fptr_00);
                                if (iVar1 == 0) {
                                  *in_stack_00000008 = 0x7d;
                                  ffpmsg((char *)0x1cd080);
                                  local_1078[0] = '\0';
                                  local_c68[0] = '\0';
                                }
                                else {
                                  iVar1 = fits_strcasecmp((char *)s1,(char *)fptr_00);
                                  if (iVar1 == 0) {
                                    *in_stack_00000008 = 0x7d;
                                    ffpmsg((char *)0x1cd0c8);
                                    local_1078[0] = '\0';
                                    local_c68[0] = '\0';
                                  }
                                  else {
                                    iVar1 = fits_strcasecmp((char *)s1,(char *)fptr_00);
                                    if (iVar1 == 0) {
                                      *in_stack_00000008 = 0x7d;
                                      ffpmsg((char *)0x1cd10d);
                                      local_1078[0] = '\0';
                                      local_c68[0] = '\0';
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    if (*in_stack_00000008 == 0) {
      if (local_18 != (char *)0x0) {
        sVar2 = strlen(local_c68);
        if (sVar2 == 0) {
          *local_18 = '\0';
        }
        else {
          pcVar3 = strstr(local_c68,"://");
          if (pcVar3 == (char *)0x0) {
            local_3c = 0;
          }
          else {
            local_3c = ((int)pcVar3 + 3) - (int)local_c68;
            strncpy(local_18,local_c68,(long)local_3c);
          }
          iVar1 = fits_path2url((char *)CONCAT71(in_stack_ffffffffffffeb79,cVar4),
                                in_stack_ffffffffffffeb74,in_stack_ffffffffffffeb68,
                                in_stack_ffffffffffffeb60);
          *in_stack_00000008 = iVar1;
        }
      }
      if (local_20 != (char *)0x0) {
        sVar2 = strlen(local_1078);
        if (sVar2 == 0) {
          *local_20 = '\0';
        }
        else {
          pcVar3 = strstr(local_1078,"://");
          if (pcVar3 == (char *)0x0) {
            local_3c = 0;
          }
          else {
            local_3c = ((int)pcVar3 + 3) - (int)local_1078;
            strncpy(local_20,local_1078,(long)local_3c);
          }
          iVar1 = fits_path2url((char *)CONCAT71(in_stack_ffffffffffffeb79,cVar4),
                                in_stack_ffffffffffffeb74,in_stack_ffffffffffffeb68,
                                in_stack_ffffffffffffeb60);
          *in_stack_00000008 = iVar1;
        }
      }
      if (local_28 != (char *)0x0) {
        strcpy(local_28,&stack0xffffffffffffeb78);
      }
      if (local_30 != (char *)0x0) {
        strcpy(local_30,local_1898);
      }
      if (local_38 != (int *)0x0) {
        *local_38 = local_40;
      }
    }
    local_4 = *in_stack_00000008;
  }
  else {
    local_4 = *in_stack_00000008;
  }
  return local_4;
}

Assistant:

int  fits_get_url(fitsfile *fptr,       /* I ptr to FITS file to evaluate    */
		  char     *realURL,    /* O URL of real FITS file           */
		  char     *startURL,   /* O URL of starting FITS file       */
		  char     *realAccess, /* O true access method of FITS file */
		  char     *startAccess,/* O "official" access of FITS file  */
		  int      *iostate,    /* O can this file be modified?      */
		  int      *status)
/*
  For grouping convention purposes, determine the URL of the FITS file
  associated with the fitsfile pointer fptr. The true access type (file://,
  mem://, shmem://, root://), starting "official" access type, and iostate 
  (0 ==> readonly, 1 ==> readwrite) are also returned.

  It is assumed that the url string has enough room to hold the resulting
  URL, and the the accessType string has enough room to hold the access type.
*/
{
  int i;
  int tmpIOstate = 0;

  char infile[FLEN_FILENAME];
  char outfile[FLEN_FILENAME];
  char tmpStr1[FLEN_FILENAME];
  char tmpStr2[FLEN_FILENAME];
  char tmpStr3[FLEN_FILENAME];
  char tmpStr4[FLEN_FILENAME];
  char *tmpPtr;


  if(*status != 0) return(*status);

  do
    {
      /* 
	 retrieve the member HDU's file name as opened by ffopen() 
	 and parse it into its constitutent pieces; get the currently
	 active driver token too
       */
	  
      *tmpStr1 = *tmpStr2 = *tmpStr3 = *tmpStr4 = 0;

      *status = fits_file_name(fptr,tmpStr1,status);

      *status = ffiurl(tmpStr1,NULL,infile,outfile,NULL,tmpStr2,tmpStr3,
		       tmpStr4,status);

      if((*tmpStr2) || (*tmpStr3) || (*tmpStr4)) tmpIOstate = -1;
 
      *status = ffurlt(fptr,tmpStr3,status);

      strcpy(tmpStr4,tmpStr3);

      *status = ffrtnm(tmpStr1,tmpStr2,status);
      strcpy(tmpStr1,tmpStr2);

      /*
	for grouping convention purposes (only) determine the URL of the
	actual FITS file being used for the given fptr, its true access 
	type (file://, mem://, shmem://, root://) and its iostate (0 ==>
	read only, 1 ==> readwrite)
      */

      /*
	The first set of access types are "simple" in that they do not
	use any redirection to temporary memory or outfiles
       */

      /* standard disk file driver is in use */
      
      if(fits_strcasecmp(tmpStr3,"file://")              == 0)         
	{
	  tmpIOstate = 1;
	  
	  if(strlen(outfile)) strcpy(tmpStr1,outfile);
	  else *tmpStr2 = 0;

	  /*
	    make sure no FILE:// specifier is given in the tmpStr1
	    or tmpStr2 strings; the convention calls for local files
	    to have no access specification
	  */

	  if((tmpPtr = strstr(tmpStr1,"://")) != NULL)
	    {
	      strcpy(infile,tmpPtr+3);
	      strcpy(tmpStr1,infile);
	    }

	  if((tmpPtr = strstr(tmpStr2,"://")) != NULL)
	    {
	      strcpy(infile,tmpPtr+3);
	      strcpy(tmpStr2,infile);
	    }
	}

      /* file stored in conventional memory */
	  
      else if(fits_strcasecmp(tmpStr3,"mem://")          == 0)          
	{
	  if(tmpIOstate < 0)
	    {
	      /* file is a temp mem file only */
	      ffpmsg("cannot make URL from temp MEM:// file (fits_get_url)");
	      *status = URL_PARSE_ERROR;
	    }
	  else
	    {
	      /* file is a "perminate" mem file for this process */
	      tmpIOstate = 1;
	      *tmpStr2 = 0;
	    }
	}

      /* file stored in conventional memory */
 
     else if(fits_strcasecmp(tmpStr3,"memkeep://")      == 0)      
	{
	  strcpy(tmpStr3,"mem://");
	  *tmpStr4 = 0;
	  *tmpStr2 = 0;
	  tmpIOstate = 1;
	}

      /* file residing in shared memory */

      else if(fits_strcasecmp(tmpStr3,"shmem://")        == 0)        
	{
	  *tmpStr4   = 0;
	  *tmpStr2   = 0;
	  tmpIOstate = 1;
	}
      
      /* file accessed via the ROOT network protocol */

      else if(fits_strcasecmp(tmpStr3,"root://")         == 0)         
	{
	  *tmpStr4   = 0;
	  *tmpStr2   = 0;
	  tmpIOstate = 1;
	}
  
      /*
	the next set of access types redirect the contents of the original
	file to an special outfile because the original could not be
	directly modified (i.e., resides on the network, was compressed).
	In these cases the URL string takes on the value of the OUTFILE,
	the access type becomes file://, and the iostate is set to 1 (can
	read/write to the file).
      */

      /* compressed file uncompressed and written to disk */

      else if(fits_strcasecmp(tmpStr3,"compressfile://") == 0) 
	{
	  strcpy(tmpStr1,outfile);
	  strcpy(tmpStr2,infile);
	  strcpy(tmpStr3,"file://");
	  strcpy(tmpStr4,"file://");
	  tmpIOstate = 1;
	}

      /* HTTP accessed file written locally to disk */

      else if(fits_strcasecmp(tmpStr3,"httpfile://")     == 0)     
	{
	  strcpy(tmpStr1,outfile);
	  strcpy(tmpStr3,"file://");
	  strcpy(tmpStr4,"http://");
	  tmpIOstate = 1;
	}
      
      /* FTP accessd file written locally to disk */

      else if(fits_strcasecmp(tmpStr3,"ftpfile://")      == 0)      
	{
	  strcpy(tmpStr1,outfile);
	  strcpy(tmpStr3,"file://");
	  strcpy(tmpStr4,"ftp://");
	  tmpIOstate = 1;
	}
      
      /* file from STDIN written to disk */

      else if(fits_strcasecmp(tmpStr3,"stdinfile://")    == 0)    
	{
	  strcpy(tmpStr1,outfile);
	  strcpy(tmpStr3,"file://");
	  strcpy(tmpStr4,"stdin://");
	  tmpIOstate = 1;
	}

      /* 
	 the following access types use memory resident files as temporary
	 storage; they cannot be modified or be made group members for 
	 grouping conventions purposes, but their original files can be.
	 Thus, their tmpStr3s are reset to mem://, their iostate
	 values are set to 0 (for no-modification), and their URL string
	 values remain set to their original values
       */

      /* compressed disk file uncompressed into memory */

      else if(fits_strcasecmp(tmpStr3,"compress://")     == 0)     
	{
	  *tmpStr1 = 0;
	  strcpy(tmpStr2,infile);
	  strcpy(tmpStr3,"mem://");
	  strcpy(tmpStr4,"file://");
	  tmpIOstate = 0;
	}
      
      /* HTTP accessed file transferred into memory */

      else if(fits_strcasecmp(tmpStr3,"http://")         == 0)         
	{
	  *tmpStr1 = 0;
	  strcpy(tmpStr3,"mem://");
	  strcpy(tmpStr4,"http://");
	  tmpIOstate = 0;
	}
      
      /* HTTP accessed compressed file transferred into memory */

      else if(fits_strcasecmp(tmpStr3,"httpcompress://") == 0) 
	{
	  *tmpStr1 = 0;
	  strcpy(tmpStr3,"mem://");
	  strcpy(tmpStr4,"http://");
	  tmpIOstate = 0;
	}
      
      /* FTP accessed file transferred into memory */
      
      else if(fits_strcasecmp(tmpStr3,"ftp://")          == 0)          
	{
	  *tmpStr1 = 0;
	  strcpy(tmpStr3,"mem://");
	  strcpy(tmpStr4,"ftp://");
	  tmpIOstate = 0;
	}
      
      /* FTP accessed compressed file transferred into memory */

      else if(fits_strcasecmp(tmpStr3,"ftpcompress://")  == 0)  
	{
	  *tmpStr1 = 0;
	  strcpy(tmpStr3,"mem://");
	  strcpy(tmpStr4,"ftp://");
	  tmpIOstate = 0;
	}	
      
      /*
	The last set of access types cannot be used to make a meaningful URL 
	strings from; thus an error is generated
       */

      else if(fits_strcasecmp(tmpStr3,"stdin://")        == 0)        
	{
	  *status = URL_PARSE_ERROR;
	  ffpmsg("cannot make valid URL from stdin:// (fits_get_url)");
	  *tmpStr1 = *tmpStr2 = 0;
	}

      else if(fits_strcasecmp(tmpStr3,"stdout://")       == 0)       
	{
	  *status = URL_PARSE_ERROR;
	  ffpmsg("cannot make valid URL from stdout:// (fits_get_url)");
	  *tmpStr1 = *tmpStr2 = 0;
	}

      else if(fits_strcasecmp(tmpStr3,"irafmem://")      == 0)      
	{
	  *status = URL_PARSE_ERROR;
	  ffpmsg("cannot make valid URL from irafmem:// (fits_get_url)");
	  *tmpStr1 = *tmpStr2 = 0;
	}

      if(*status != 0) continue;

      /*
	 assign values to the calling parameters if they are non-NULL
      */

      if(realURL != NULL)
	{
	  if(strlen(tmpStr1) == 0)
	    *realURL = 0;
	  else
	    {
	      if((tmpPtr = strstr(tmpStr1,"://")) != NULL)
		{
		  tmpPtr += 3;
		  i = (long)tmpPtr - (long)tmpStr1;
		  strncpy(realURL,tmpStr1,i);
		}
	      else
		{
		  tmpPtr = tmpStr1;
		  i = 0;
		}

	      *status = fits_path2url(tmpPtr,FLEN_FILENAME-i,realURL+i,status);
	    }
	}

      if(startURL != NULL)
	{
	  if(strlen(tmpStr2) == 0)
	    *startURL = 0;
	  else
	    {
	      if((tmpPtr = strstr(tmpStr2,"://")) != NULL)
		{
		  tmpPtr += 3;
		  i = (long)tmpPtr - (long)tmpStr2;
		  strncpy(startURL,tmpStr2,i);
		}
	      else
		{
		  tmpPtr = tmpStr2;
		  i = 0;
		}

	      *status = fits_path2url(tmpPtr,FLEN_FILENAME-i,startURL+i,status);
	    }
	}

      if(realAccess  != NULL)  strcpy(realAccess,tmpStr3);
      if(startAccess != NULL)  strcpy(startAccess,tmpStr4);
      if(iostate     != NULL) *iostate = tmpIOstate;

    }while(0);

  return(*status);
}